

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_inline.h
# Opt level: O3

_Bool xdr_opaque_auth_decode(XDR *xdrs,opaque_auth *oa,int32_t *buf)

{
  u_int *puVar1;
  uint uVar2;
  _Bool _Var3;
  uint *puVar4;
  uint *puVar5;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  u_int uVar9;
  char local_2c [4];
  
  if (buf == (int32_t *)0x0) {
    puVar5 = (uint *)(xdrs->x_v).vio_tail;
    puVar4 = (uint *)((long)xdrs->x_data + 4);
    if (puVar5 < puVar4) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)oa);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar8 = "%s:%u ERROR oa_flavor";
        pcVar7 = "xdr_opaque_auth_decode";
        uVar6 = 0x87;
        goto LAB_00112164;
      }
      puVar4 = (uint *)xdrs->x_data;
      puVar5 = (uint *)(xdrs->x_v).vio_tail;
    }
    else {
      uVar2 = *(uint *)xdrs->x_data;
      oa->oa_flavor =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar4;
    }
    puVar1 = &oa->oa_length;
    if (puVar5 < puVar4 + 1) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,puVar1);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar8 = "%s:%u ERROR oa_length";
        pcVar7 = "xdr_opaque_auth_decode";
        uVar6 = 0x8c;
        goto LAB_00112164;
      }
      uVar9 = *puVar1;
    }
    else {
      uVar2 = *puVar4;
      uVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      *puVar1 = uVar9;
      xdrs->x_data = (uint8_t *)(puVar4 + 1);
    }
  }
  else {
    uVar2 = *buf;
    oa->oa_flavor = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = buf[1];
    uVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    oa->oa_length = uVar9;
  }
  if (uVar9 == 0) {
    return true;
  }
  if (400 < uVar9) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR oa_length (%u) > %u","xdr_opaque_auth_decode_it",0x70,(ulong)uVar9,400);
    return false;
  }
  _Var3 = (*xdrs->x_ops->x_getbytes)(xdrs,oa->oa_body,uVar9);
  if (_Var3) {
    if ((uVar9 & 3) == 0) {
      return true;
    }
    _Var3 = (*xdrs->x_ops->x_getbytes)(xdrs,local_2c,4 - (uVar9 & 3));
    if (!_Var3) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR crud","xdr_opaque_decode",0x1c9);
      return false;
    }
    return true;
  }
  if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
    return false;
  }
  pcVar8 = "%s:%u ERROR opaque";
  pcVar7 = "xdr_opaque_decode";
  uVar6 = 0x1b9;
LAB_00112164:
  (*__ntirpc_pkg_params.warnx_)(pcVar8,pcVar7,uVar6);
  return false;
}

Assistant:

static inline bool
xdr_opaque_auth_decode(XDR *xdrs, struct opaque_auth *oa, int32_t *buf)
{
	if (buf != NULL) {
		oa->oa_flavor = IXDR_GET_ENUM(buf, enum_t);
		oa->oa_length = (u_int) IXDR_GET_U_INT32(buf);
	} else if (!xdr_getenum(xdrs, (enum_t *)&oa->oa_flavor)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_flavor",
			__func__, __LINE__);
		return (false);
	} else if (!xdr_getuint32(xdrs, &oa->oa_length)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_length",
			__func__, __LINE__);
		return (false);
	}

	if (oa->oa_length) {
		/* only call and alloc for > 0 length */
		return xdr_opaque_auth_decode_it(xdrs, oa);
	}
	return (true);	/* 0 length succeeds */
}